

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Max::backward_impl
          (Max *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint in_R8D;
  Tensor t;
  float *in_stack_fffffffffffffe20;
  Dim *in_stack_fffffffffffffe28;
  Tensor *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffe38;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe40;
  Tensor *in_stack_fffffffffffffe48;
  
  if (in_R8D < 2) {
    Tensor::Tensor(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    if (in_R8D == 0) {
      Tensor::operator*(in_stack_fffffffffffffe48);
      Tensor::operator*(in_stack_fffffffffffffe48);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      cwiseProduct<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      Tensor::operator*(in_stack_fffffffffffffe48);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator+=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    else {
      Tensor::operator*(in_stack_fffffffffffffe48);
      Tensor::operator*(in_stack_fffffffffffffe48);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      binaryExpr<cnn::FMaxBackwardInv,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffe38,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffe30,(FMaxBackwardInv *)in_stack_fffffffffffffe28);
      Tensor::operator*(in_stack_fffffffffffffe48);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator+=(in_stack_fffffffffffffe40,
                 (MatrixBase<Eigen::CwiseBinaryOp<cnn::FMaxBackwardInv,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)in_stack_fffffffffffffe38);
    }
    Tensor::~Tensor((Tensor *)0x368cf3);
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0xbd,
                "virtual void cnn::Max::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Max::backward_impl(const vector<const Tensor*>& xs,
                   const Tensor& fx,
                   const Tensor& dEdf,
                   unsigned i,
                   Tensor& dEdxi) const {
  assert(i < 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("Max not yet implemented for CUDA");
#else
  const Tensor t(dEdxi.d, static_cast<float*>(aux_mem));
  if (i == 0) {
    *dEdxi += (*t).cwiseProduct(*dEdf);
  } else {
    *dEdxi += (*t).binaryExpr(*dEdf, FMaxBackwardInv());
  }
#endif
}